

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

char * __thiscall
CTcConstVal::cvt_to_str(CTcConstVal *this,char *buf,size_t bufl,size_t *result_len)

{
  size_t sVar1;
  
  switch(this->typ_) {
  case TC_CVT_NIL:
    if (3 < bufl) {
      builtin_strncpy(buf,"nil",4);
      *result_len = 3;
      return buf;
    }
    break;
  case TC_CVT_TRUE:
    if (4 < bufl) {
      builtin_strncpy(buf,"true",5);
      *result_len = 4;
      return buf;
    }
    break;
  case TC_CVT_INT:
    if (0xb < bufl) {
      sprintf(buf,"%ld",(this->val_).intval_);
      sVar1 = strlen(buf);
      *result_len = sVar1;
      return buf;
    }
    break;
  case TC_CVT_SSTR:
switchD_0022acdc_caseD_4:
    *result_len = (this->val_).floatval_.len_;
    return (char *)(this->val_).intval_;
  default:
    if (this->typ_ == TC_CVT_FLOAT) goto switchD_0022acdc_caseD_4;
  }
  return (char *)0x0;
}

Assistant:

const char *CTcConstVal::cvt_to_str(char *buf, size_t bufl,
                                    size_t *result_len)
{
    /* check my type */
    switch(typ_)
    {
    case TC_CVT_NIL:
        /* the result is "nil" */
        if (bufl < 4)
            return 0;

        strcpy(buf, "nil");
        *result_len = 3;
        return buf;

    case TC_CVT_TRUE:
        /* the result is "true" */
        if (bufl < 5)
            return 0;

        strcpy(buf, "true");
        *result_len = 4;
        return buf;

    case TC_CVT_SSTR:
        /* it's already a string */
        *result_len = get_val_str_len();
        return get_val_str();

    case TC_CVT_INT:
        /* convert our signed integer value */
        if (bufl < 12)
            return 0;

        sprintf(buf, "%ld", get_val_int());
        *result_len = strlen(buf);
        return buf;

    case TC_CVT_FLOAT:
        /* we store these as strings */
        *result_len = get_val_float_len();
        return get_val_float();

    default:
        /* can't convert other types */
        return 0;
    }
}